

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol.cpp
# Opt level: O0

int32_t ucol_getBound_63(uint8_t *source,int32_t sourceLength,UColBoundMode boundType,
                        uint32_t noOfLevels,uint8_t *result,int32_t resultLength,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  bool local_3a;
  int local_38;
  int32_t sourceIndex;
  int32_t resultLength_local;
  uint8_t *result_local;
  uint32_t noOfLevels_local;
  UColBoundMode boundType_local;
  int32_t sourceLength_local;
  uint8_t *source_local;
  
  if ((status == (UErrorCode *)0x0) || (UVar1 = U_FAILURE(*status), UVar1 != '\0')) {
    source_local._4_4_ = 0;
  }
  else if (source == (uint8_t *)0x0) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    source_local._4_4_ = 0;
  }
  else {
    local_38 = 0;
    iVar2 = local_38;
    result_local._4_4_ = noOfLevels;
    do {
      local_38 = iVar2;
      iVar2 = local_38 + 1;
      if (source[iVar2] == '\x01') {
        result_local._4_4_ = result_local._4_4_ - 1;
      }
      local_3a = false;
      if (result_local._4_4_ != 0) {
        local_3a = source[iVar2] != '\0' || iVar2 < sourceLength;
      }
    } while (local_3a);
    if (((source[iVar2] == '\0') || (iVar2 == sourceLength)) && (result_local._4_4_ != 0)) {
      *status = U_SORT_KEY_TOO_SHORT_WARNING;
    }
    if ((result == (uint8_t *)0x0) || (resultLength < (int)(iVar2 + boundType))) {
      source_local._4_4_ = iVar2 + boundType + 1;
    }
    else {
      memcpy(result,source,(long)iVar2);
      if (boundType != UCOL_BOUND_LOWER) {
        if (boundType == UCOL_BOUND_UPPER) {
          result[iVar2] = '\x02';
          iVar2 = local_38 + 2;
        }
        else {
          if (boundType != UCOL_BOUND_UPPER_LONG) {
            *status = U_ILLEGAL_ARGUMENT_ERROR;
            return 0;
          }
          result[iVar2] = 0xff;
          result[local_38 + 2] = 0xff;
          iVar2 = local_38 + 3;
        }
      }
      local_38 = iVar2;
      source_local._4_4_ = local_38 + 1;
      result[local_38] = '\0';
    }
  }
  return source_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucol_getBound(const uint8_t       *source,
        int32_t             sourceLength,
        UColBoundMode       boundType,
        uint32_t            noOfLevels,
        uint8_t             *result,
        int32_t             resultLength,
        UErrorCode          *status)
{
    // consistency checks
    if(status == NULL || U_FAILURE(*status)) {
        return 0;
    }
    if(source == NULL) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    int32_t sourceIndex = 0;
    // Scan the string until we skip enough of the key OR reach the end of the key
    do {
        sourceIndex++;
        if(source[sourceIndex] == Collation::LEVEL_SEPARATOR_BYTE) {
            noOfLevels--;
        }
    } while (noOfLevels > 0
        && (source[sourceIndex] != 0 || sourceIndex < sourceLength));

    if((source[sourceIndex] == 0 || sourceIndex == sourceLength)
        && noOfLevels > 0) {
            *status = U_SORT_KEY_TOO_SHORT_WARNING;
    }


    // READ ME: this code assumes that the values for boundType
    // enum will not changes. They are set so that the enum value
    // corresponds to the number of extra bytes each bound type
    // needs.
    if(result != NULL && resultLength >= sourceIndex+boundType) {
        uprv_memcpy(result, source, sourceIndex);
        switch(boundType) {
            // Lower bound just gets terminated. No extra bytes
        case UCOL_BOUND_LOWER: // = 0
            break;
            // Upper bound needs one extra byte
        case UCOL_BOUND_UPPER: // = 1
            result[sourceIndex++] = 2;
            break;
            // Upper long bound needs two extra bytes
        case UCOL_BOUND_UPPER_LONG: // = 2
            result[sourceIndex++] = 0xFF;
            result[sourceIndex++] = 0xFF;
            break;
        default:
            *status = U_ILLEGAL_ARGUMENT_ERROR;
            return 0;
        }
        result[sourceIndex++] = 0;

        return sourceIndex;
    } else {
        return sourceIndex+boundType+1;
    }
}